

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

string * __thiscall
google::protobuf::MessageLite::SerializeAsString_abi_cxx11_
          (string *__return_storage_ptr__,MessageLite *this)

{
  bool bVar1;
  MessageLite *this_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = AppendToString(this,__return_storage_ptr__);
  if (!bVar1) {
    std::__cxx11::string::clear();
  }
  return __return_storage_ptr__;
}

Assistant:

string MessageLite::SerializeAsString() const {
  // If the compiler implements the (Named) Return Value Optimization,
  // the local variable 'result' will not actually reside on the stack
  // of this function, but will be overlaid with the object that the
  // caller supplied for the return value to be constructed in.
  string output;
  if (!AppendToString(&output))
    output.clear();
  return output;
}